

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::Worker::Worker(Worker *this)

{
  _Rb_tree_header *p_Var1;
  
  this->close_pending_ = false;
  this->abort_ = false;
  this->done_ = false;
  this->pending_entries_in_queue_ = false;
  memset(&this->handle_,0,0x90);
  std::
  _Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  ::_M_initialize_map(&(this->queue_).
                       super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                      ,0);
  p_Var1 = &(this->ongoing_)._M_t._M_impl.super__Rb_tree_header;
  (this->ongoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ongoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ongoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ongoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ongoing_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Signaler::Signaler(&this->signal_);
  return;
}

Assistant:

Worker() = default;